

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::remove_attributes(xml_node *this)

{
  xml_node_struct *pxVar1;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar2;
  ulong uVar3;
  xml_node_struct *pxVar4;
  xml_attribute_struct *ptr;
  
  pxVar1 = this->_root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    pxVar4 = pxVar1;
    if (pxVar1->first_attribute != (xml_attribute_struct *)0x0) {
      this_00 = *(xml_allocator **)((long)pxVar1 - (pxVar1->header >> 8));
      ptr = pxVar1->first_attribute;
      do {
        uVar3 = ptr->header;
        pxVar2 = ptr->next_attribute;
        if ((uVar3 & 0x20) != 0) {
          impl::anon_unknown_0::xml_allocator::deallocate_string(this_00,ptr->name);
          uVar3 = ptr->header;
        }
        if ((uVar3 & 0x10) != 0) {
          impl::anon_unknown_0::xml_allocator::deallocate_string(this_00,ptr->value);
          uVar3 = ptr->header;
        }
        impl::anon_unknown_0::xml_allocator::deallocate_memory
                  (this_00,ptr,0x28,(xml_memory_page *)((long)ptr - (uVar3 >> 8)));
        ptr = pxVar2;
      } while (pxVar2 != (xml_attribute_struct *)0x0);
      pxVar4 = this->_root;
    }
    pxVar4->first_attribute = (xml_attribute_struct *)0x0;
  }
  return pxVar1 != (xml_node_struct *)0x0;
}

Assistant:

PUGI__FN bool xml_node::remove_attributes()
	{
		if (!_root) return false;
		
		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_attribute_struct* attr = _root->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			impl::destroy_attribute(attr, alloc);

			attr = next;
		}

		_root->first_attribute = 0;

		return true;
	}